

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checkregular(tetgenmesh *this,int type)

{
  memorypool *pmVar1;
  void **ppvVar2;
  ulong uVar3;
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  bool bVar4;
  uint uVar5;
  tetrahedron *pppdVar6;
  tetrahedron *pppdVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  int (*paiVar11) [12];
  char *pcVar12;
  long lVar13;
  double dVar14;
  int local_5c;
  ulong local_50;
  
  pcVar10 = "regular";
  if (this->b->quiet == 0) {
    pcVar12 = "regular";
    if ((type & 2U) == 0) {
      pcVar12 = "Delaunay";
    }
    pcVar9 = "(s)";
    if ((type & 1U) == 0) {
      pcVar9 = " ";
    }
    printf("  Checking %s %s property of the mesh...\n",pcVar12,pcVar9);
  }
  pmVar1 = this->tetrahedrons;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  uVar5 = 0;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  pppdVar6 = tetrahedrontraverse(this);
  if (pppdVar6 == (tetrahedron *)0x0) {
    bVar4 = false;
  }
  else {
    if ((type & 2U) == 0) {
      pcVar10 = "Delaunay";
    }
    uVar5 = 0;
    local_5c = 0;
    local_50 = 0;
    do {
      paiVar11 = fsymtbl;
      lVar13 = 0;
      do {
        uVar3 = *(ulong *)((long)pppdVar6 + lVar13 * 2);
        pppdVar7 = (tetrahedron *)(uVar3 & 0xfffffffffffffff0);
        if (pppdVar6 < pppdVar7 && pppdVar7[7] != (tetrahedron)this->dummypoint) {
          pb = pppdVar6[*(int *)((long)orgpivot + lVar13)];
          pa = pppdVar6[*(int *)((long)destpivot + lVar13)];
          pc = pppdVar6[*(int *)((long)apexpivot + lVar13)];
          pd = pppdVar6[*(int *)((long)oppopivot + lVar13)];
          pe = pppdVar7[oppopivot[(*paiVar11)[(uint)uVar3 & 0xf]]];
          if (type == 2) {
            dVar14 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,
                              (double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3],(double)pe[3])
            ;
          }
          else if (type == 1) {
            dVar14 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,
                                (double *)pe);
          }
          else if (type == 0) {
            dVar14 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
          }
          else {
            dVar14 = orient4d_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,
                                (double *)pe,(double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3]
                                ,(double)pe[3]);
          }
          if (0.0 < dVar14) {
            if (this->checksubfaceflag != 0) {
              if (pppdVar6[9] == (tetrahedron)0x0) {
                local_50 = 0;
              }
              else {
                local_50 = *(ulong *)((long)pppdVar6[9] + lVar13 * 2) & 0xfffffffffffffff8;
              }
            }
            local_5c = local_5c + 1;
            if (local_50 == 0) {
              lVar8 = (long)this->pointmarkindex;
              printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",pcVar10,
                     (ulong)*(uint *)((long)pb + lVar8 * 4),(ulong)*(uint *)((long)pa + lVar8 * 4),
                     (ulong)*(uint *)((long)pc + lVar8 * 4),(ulong)*(uint *)((long)pd + lVar8 * 4),
                     *(undefined4 *)((long)pe + lVar8 * 4));
              uVar5 = uVar5 + 1;
            }
          }
        }
        lVar13 = lVar13 + 4;
        paiVar11 = paiVar11 + 1;
      } while (lVar13 != 0x10);
      pppdVar6 = tetrahedrontraverse(this);
    } while (pppdVar6 != (tetrahedron *)0x0);
    bVar4 = 0 < local_5c;
  }
  pcVar10 = "regular";
  if (uVar5 == 0) {
    if (this->b->quiet == 0) {
      if ((type & 2U) == 0) {
        pcVar10 = "Delaunay";
      }
      if (bVar4) {
        pcVar12 = "  The mesh is constrained %s.\n";
      }
      else {
        pcVar12 = "  The mesh is %s.\n";
      }
      printf(pcVar12,pcVar10);
    }
  }
  else {
    if ((type & 2U) == 0) {
      pcVar10 = "Delaunay";
    }
    printf("  !! !! !! !! Found %d non-%s faces.\n",(ulong)uVar5,pcVar10);
  }
  return uVar5;
}

Assistant:

int tetgenmesh::checkregular(int type)
{
  triface tetloop;
  triface symtet;
  face checksh;
  point p[5];
  REAL sign;
  int ndcount; // Count the non-locally Delaunay faces.
  int horrors;

  if (!b->quiet) {
    printf("  Checking %s %s property of the mesh...\n",
           (type & 2) == 0 ? "Delaunay" : "regular",
           (type & 1) == 0 ? " " : "(s)");
  }

  // Make sure orient3d(p[1], p[0], p[2], p[3]) > 0;
  //   Hence if (insphere(p[1], p[0], p[2], p[3], p[4]) > 0) means that
  //     p[4] lies inside the circumsphere of p[1], p[0], p[2], p[3].
  //   The same if orient4d(p[1], p[0], p[2], p[3], p[4]) > 0 means that
  //     p[4] lies below the oriented hyperplane passing through 
  //     p[1], p[0], p[2], p[3].

  ndcount = 0;
  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of triangles, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, symtet);
      // Only do test if its adjoining tet is not a hull tet or its pointer
      //   is larger (to ensure that each pair isn't tested twice).
      if (((point) symtet.tet[7] != dummypoint)&&(tetloop.tet < symtet.tet)) {
        p[0] = org(tetloop);   // pa
        p[1] = dest(tetloop);  // pb
        p[2] = apex(tetloop);  // pc
        p[3] = oppo(tetloop);  // pd
        p[4] = oppo(symtet);   // pe

        if (type == 0) {
          sign = insphere(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 1) {
          sign = insphere_s(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 2) {
          sign = orient4d(p[1],    p[0],    p[2],    p[3],    p[4], 
                          p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        } else { // type == 3
          sign = orient4d_s(p[1],    p[0],    p[2],    p[3],    p[4], 
                            p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        }

        if (sign > 0.0) {
          ndcount++;
          if (checksubfaceflag) {
            tspivot(tetloop, checksh);
          }
          if (checksh.sh == NULL) {
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",
                   (type & 2) == 0 ? "Delaunay" : "regular",
		   pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                   pointmark(p[3]), pointmark(p[4]));
            horrors++;
          }
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (horrors == 0) {
    if (!b->quiet) {
      if (ndcount > 0) {
        printf("  The mesh is constrained %s.\n",
               (type & 2) == 0 ? "Delaunay" : "regular");
      } else {
        printf("  The mesh is %s.\n", (type & 2) == 0 ? "Delaunay" : "regular");
      } 
    }
  } else {
    printf("  !! !! !! !! Found %d non-%s faces.\n", horrors,
           (type & 2) == 0 ? "Delaunay" : "regular");
  }

  return horrors;
}